

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

ptr<req_msg> __thiscall
nuraft::raft_server::create_append_entries_req(raft_server *this,ptr<peer> *pp)

{
  undefined1 *puVar1;
  __normal_iterator<std::shared_ptr<nuraft::log_entry>_*,_std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
  __last;
  const_iterator __position;
  _func_int ***ppp_Var2;
  undefined1 auVar3 [8];
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  element_type *peVar8;
  undefined4 extraout_var;
  __int_type _Var9;
  ulong uVar10;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  unsigned_long *puVar14;
  int64 iVar15;
  element_type *peVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  element_type *peVar18;
  element_type *peVar19;
  size_type sVar20;
  element_type *peVar21;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  ptr<req_msg> pVar22;
  ulong in_stack_00000018;
  ulong in_stack_00000020;
  ulong in_stack_00000028;
  ptr<peer> *in_stack_00000030;
  raft_server *in_stack_00000038;
  bool *in_stack_00000050;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *v;
  ulong adjusted_end_idx;
  ulong last_log_term;
  ptr<log_entry> custom_noti_le;
  ptr<custom_notification_msg> custom_noti;
  ptr<out_of_log_msg> ool_msg;
  int log_lv;
  bool succeeded_out;
  ptr<snapshot> snp_local;
  ptr<std::vector<ptr<log_entry>_>_> log_entries;
  ulong prev_end_idx;
  int32 cur_cnt;
  ulong peer_last_sent_idx;
  ulong end_idx;
  bool entries_valid;
  lock_guard<std::mutex> guard_1;
  unique_lock<std::recursive_mutex> guard;
  ulong starting_idx;
  ulong term;
  ulong last_log_idx;
  ulong commit_idx;
  ulong cur_nxt_idx;
  peer *p;
  ptr<req_msg> *req;
  mutex_type *in_stack_fffffffffffffa98;
  shared_ptr<nuraft::buffer> *__r;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *this_00;
  peer *in_stack_fffffffffffffaa0;
  undefined1 fire_first_event;
  shared_ptr<nuraft::buffer> *this_01;
  peer *ppVar23;
  peer *in_stack_fffffffffffffaa8;
  timer_helper *in_stack_fffffffffffffab0;
  raft_server *in_stack_fffffffffffffab8;
  msg_type *in_stack_fffffffffffffac0;
  unsigned_long *in_stack_fffffffffffffac8;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  __normal_iterator<std::shared_ptr<nuraft::log_entry>_*,_std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
  in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  size_type local_4f0;
  ulong in_stack_fffffffffffffbb0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var24;
  raft_server *in_stack_fffffffffffffbb8;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  undefined1 *local_270;
  ulong local_268;
  undefined1 local_259;
  undefined4 local_244;
  undefined4 local_21c;
  undefined4 local_1f8;
  int32 local_1f4;
  undefined4 local_1f0;
  byte local_1e9;
  string local_1e8 [36];
  uint local_1c4;
  undefined4 local_1c0;
  undefined1 local_1b9;
  string local_1b8 [32];
  __shared_ptr local_198 [16];
  string local_188 [32];
  undefined1 local_168 [32];
  __shared_ptr local_148 [16];
  string local_138 [32];
  undefined1 *local_118;
  undefined1 *local_110;
  string local_108 [36];
  uint local_e4;
  peer *local_e0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  byte local_b1;
  string local_b0 [32];
  string local_90 [72];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  ulong local_40;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  element_type *local_20;
  
  local_20 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffffaa0);
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = (undefined1  [8])0x0;
  local_40 = 0;
  local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffaa0,
             (mutex_type *)in_stack_fffffffffffffa98);
  peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b5a53);
  iVar5 = (*peVar8->_vptr_log_store[3])();
  local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar5);
  _Var9 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffaa8);
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(_Var9 + 1);
  local_30._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__atomic_base::operator_cast_to_unsigned_long
                 ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffaa8);
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b5ac8);
  local_40 = srv_state::get_term((srv_state *)0x1b5ad0);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffaa0);
  peer::get_lock(local_20);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  uVar10 = peer::get_next_log_idx((peer *)0x1b5b21);
  if (uVar10 == 0) {
    peer::set_next_log_idx(in_stack_fffffffffffffaa0,(ulong)in_stack_fffffffffffffa98);
  }
  uVar10 = peer::get_next_log_idx((peer *)0x1b5bab);
  local_38 = (undefined1  [8])(uVar10 - 1);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b5bd6);
  if (local_28._M_pi <= (ulong)local_38) {
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar4) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b5c1d);
      iVar5 = (*peVar11->_vptr_logger[7])();
      if (1 < iVar5) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b5c43);
        msg_if_given_abi_cxx11_
                  ((char *)local_90,"Peer\'s lastLogIndex is too large %lu v.s. %lu, ",local_38,
                   local_28._M_pi);
        (*peVar11->_vptr_logger[8])
                  (peVar11,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x18b,local_90);
        std::__cxx11::string::~string(local_90);
      }
    }
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1b5cf6);
    peVar12 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b5cfe);
    (*peVar12->_vptr_state_mgr[8])(peVar12,0xfffffff8);
    exit(-1);
  }
  bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  if (bVar4) {
    peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b5d47);
    iVar5 = (*peVar11->_vptr_logger[7])();
    if (5 < iVar5) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b5d6d);
      msg_if_given_abi_cxx11_
                ((char *)local_b0,"last_log_idx: %lu, starting_idx: %lu, cur_nxt_idx: %lu\n",
                 local_38,local_48,local_28._M_pi);
      (*peVar11->_vptr_logger[8])
                (peVar11,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"create_append_entries_req",0x199,local_b0);
      std::__cxx11::string::~string(local_b0);
    }
  }
  auVar3 = local_38;
  local_b1 = local_48 <=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)(_func_int ***)local_38 + 1U);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1b5e56);
  nuraft::context::get_params((context *)in_stack_fffffffffffffab8);
  peVar13 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b5e7b);
  local_c8 = (undefined1 *)((long)(_func_int ***)auVar3 + (long)peVar13->max_append_size_ + 1);
  puVar14 = std::min<unsigned_long>
                      ((unsigned_long *)&stack0xffffffffffffffd8,(unsigned_long *)&local_c8);
  puVar1 = (undefined1 *)*puVar14;
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1b5ed6);
  local_c0 = puVar1;
  local_e0 = (peer *)peer::get_last_sent_idx(in_stack_fffffffffffffaa8);
  if (((peer *)((long)(_func_int ***)local_38 + 1U) == local_e0) &&
     ((undefined1 *)((long)(_func_int ***)local_38 + 2U) < local_c0)) {
    local_e4 = peer::inc_cnt_not_applied(in_stack_fffffffffffffaa0);
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar4) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b5f74);
      iVar5 = (*peVar11->_vptr_logger[7])();
      if (4 < iVar5) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b5f9a);
        ppVar23 = local_e0;
        uVar6 = peer::get_id((peer *)0x1b5fbf);
        msg_if_given_abi_cxx11_
                  ((char *)local_108,"last sent log (%lu) to peer %d is not applied, cnt %d",ppVar23
                   ,(ulong)uVar6,(ulong)local_e4);
        (*peVar11->_vptr_logger[8])
                  (peVar11,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1ad,local_108);
        std::__cxx11::string::~string(local_108);
      }
    }
    if (4 < (int)local_e4) {
      local_110 = local_c0;
      local_118 = (undefined1 *)((long)(_func_int ***)local_38 + 2);
      puVar14 = std::min<unsigned_long>
                          ((unsigned_long *)&stack0xffffffffffffffd8,(unsigned_long *)&local_118);
      local_c0 = (undefined1 *)*puVar14;
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b6105);
        iVar5 = (*peVar11->_vptr_logger[7])();
        if (4 < iVar5) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b612b);
          msg_if_given_abi_cxx11_((char *)local_138,"reduce end_idx %lu -> %lu",local_110,local_c0);
          (*peVar11->_vptr_logger[8])
                    (peVar11,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x1b1,local_138);
          std::__cxx11::string::~string(local_138);
        }
      }
    }
  }
  else {
    peer::reset_cnt_not_applied((peer *)0x1b61db);
  }
  std::
  shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
  ::shared_ptr((shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                *)0x1b61e8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)(_func_int ***)local_38 + 1U) <
      local_28._M_pi) {
    if ((local_b1 & 1) != 0) {
      peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1b6254);
      puVar1 = local_c0;
      ppp_Var2 = (_func_int ***)local_38;
      iVar15 = peer::get_next_batch_size_hint_in_bytes((peer *)0x1b628c);
      (*peVar8->_vptr_log_store[9])
                (local_168,peVar8,(undefined1 *)((long)ppp_Var2 + 1),puVar1,iVar15);
      std::
      shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
      ::operator=((shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                   *)in_stack_fffffffffffffaa0,
                  (shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                   *)in_stack_fffffffffffffa98);
      std::
      shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
      ::~shared_ptr((shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                     *)0x1b62eb);
      bVar4 = std::operator==((shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                               *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      if (bVar4) {
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar4) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b6336);
          iVar5 = (*peVar11->_vptr_logger[7])();
          if (2 < iVar5) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1b636f);
            msg_if_given_abi_cxx11_
                      ((char *)local_188,"failed to retrieve log entries: %lu - %lu",
                       (undefined1 *)((long)(_func_int ***)local_38 + 1),local_c0);
            (*peVar11->_vptr_logger[8])
                      (peVar11,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"create_append_entries_req",0x1bf,local_188);
            std::__cxx11::string::~string(local_188);
          }
        }
        local_b1 = 0;
      }
    }
    fire_first_event = (undefined1)((ulong)in_stack_fffffffffffffaa0 >> 0x38);
  }
  else {
    std::
    shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
    ::shared_ptr((shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                  *)0x1b620b);
    std::
    shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
    ::operator=((shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                 *)in_stack_fffffffffffffaa0,
                (shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                 *)in_stack_fffffffffffffa98);
    fire_first_event = (undefined1)((ulong)in_stack_fffffffffffffaa0 >> 0x38);
    std::
    shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
    ::~shared_ptr((shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                   *)0x1b622d);
  }
  if ((local_b1 & 1) != 0) {
    local_268 = term_for_log(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    local_270 = local_c0;
    bVar4 = std::__shared_ptr::operator_cast_to_bool(local_148);
    auVar3 = local_38;
    if (bVar4) {
      peVar21 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b6c2b);
      sVar20 = std::
               vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ::size(peVar21);
      local_270 = (undefined1 *)((long)(_func_int ***)auVar3 + sVar20 + 1);
    }
    if ((local_270 != local_c0) &&
       (bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318)), bVar4))
    {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b6c90);
      iVar5 = (*peVar11->_vptr_logger[7])();
      if (5 < iVar5) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b6cc9);
        msg_if_given_abi_cxx11_
                  ((char *)local_290,"adjusted end_idx due to batch size hint: %lu -> %lu",local_c0,
                   local_270);
        (*peVar11->_vptr_logger[8])
                  (peVar11,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x200,local_290);
        std::__cxx11::string::~string(local_290);
      }
    }
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar4) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b6d95);
      iVar5 = (*peVar11->_vptr_logger[7])();
      if (4 < iVar5) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b6dce);
        uVar6 = peer::get_id((peer *)0x1b6de3);
        auVar3 = local_38;
        uVar10 = local_268;
        bVar4 = std::__shared_ptr::operator_cast_to_bool(local_148);
        if (bVar4) {
          peVar21 = std::
                    __shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1b6e2c);
          local_4f0 = std::
                      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                      ::size(peVar21);
        }
        else {
          local_4f0 = 0;
        }
        in_stack_fffffffffffffaa8 = local_e0;
        msg_if_given_abi_cxx11_
                  ((char *)local_2b0,
                   "append_entries for %d with LastLogIndex=%lu, LastLogTerm=%lu, EntriesLength=%zu, CommitIndex=%lu, Term=%lu, peer_last_sent_idx %lu"
                   ,(ulong)uVar6,auVar3,uVar10,local_4f0,local_30._M_pi,local_40);
        (*peVar11->_vptr_logger[8])
                  (peVar11,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x208,local_2b0);
        std::__cxx11::string::~string(local_2b0);
      }
    }
    if ((undefined1 *)((long)(_func_int ***)local_38 + 1U) == local_270) {
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b6f52);
        iVar5 = (*peVar11->_vptr_logger[7])();
        if (5 < iVar5) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b6f85);
          msg_if_given_abi_cxx11_((char *)local_2d0,"EMPTY PAYLOAD");
          (*peVar11->_vptr_logger[8])
                    (peVar11,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x20a,local_2d0);
          std::__cxx11::string::~string(local_2d0);
        }
      }
    }
    else if ((undefined1 *)((long)(_func_int ***)local_38 + 2U) == local_270) {
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b705c);
        in_stack_fffffffffffffafc = (*peVar11->_vptr_logger[7])();
        if (4 < in_stack_fffffffffffffafc) {
          in_stack_fffffffffffffaf0._M_current =
               (shared_ptr<nuraft::log_entry> *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b708f);
          msg_if_given_abi_cxx11_
                    ((char *)local_2f0,"idx: %lu",(undefined1 *)((long)(_func_int ***)local_38 + 1))
          ;
          (*(code *)((in_stack_fffffffffffffaf0._M_current)->
                    super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                    buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi)(in_stack_fffffffffffffaf0._M_current,5,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                            ,"create_append_entries_req",0x20c,local_2f0);
          std::__cxx11::string::~string(local_2f0);
        }
      }
    }
    else {
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b7153);
        in_stack_fffffffffffffaec = (*peVar11->_vptr_logger[7])();
        if (4 < in_stack_fffffffffffffaec) {
          in_stack_fffffffffffffae0 =
               (vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                *)std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b7186);
          msg_if_given_abi_cxx11_
                    ((char *)local_310,"idx range: %lu-%lu",
                     (undefined1 *)((long)(_func_int ***)local_38 + 1),local_270 + -1);
          (*(code *)(in_stack_fffffffffffffae0->
                    super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    (in_stack_fffffffffffffae0,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x20e,local_310);
          std::__cxx11::string::~string(local_310);
        }
      }
    }
    peer::get_id((peer *)0x1b7254);
    ppVar23 = (peer *)&stack0xffffffffffffffd0;
    this_00 = (vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               *)local_38;
    cs_new<nuraft::req_msg,unsigned_long&,nuraft::msg_type,int&,int,unsigned_long&,unsigned_long&,unsigned_long&>
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,(int *)in_stack_fffffffffffffab8,
               (int *)in_stack_fffffffffffffab0,(unsigned_long *)in_stack_fffffffffffffaa8,
               (unsigned_long *)in_stack_fffffffffffffae0,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    peVar19 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b72c0);
    req_msg::log_entries(peVar19);
    bVar4 = std::__shared_ptr::operator_cast_to_bool(local_148);
    if (bVar4) {
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::end(this_00);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<nuraft::log_entry>const*,std::vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>>
      ::__normal_iterator<std::shared_ptr<nuraft::log_entry>*>
                ((__normal_iterator<const_std::shared_ptr<nuraft::log_entry>_*,_std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                  *)ppVar23,
                 (__normal_iterator<std::shared_ptr<nuraft::log_entry>_*,_std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                  *)this_00);
      std::
      __shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b7333);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::begin(this_00);
      std::
      __shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b734d);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::end(this_00);
      __position._M_current._4_4_ = in_stack_fffffffffffffafc;
      __position._M_current._0_4_ = in_stack_fffffffffffffaf8;
      __last._M_current._4_4_ = in_stack_fffffffffffffaec;
      __last._M_current._0_4_ = in_stack_fffffffffffffae8;
      std::
      vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::shared_ptr<nuraft::log_entry>*,std::vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>>,void>
                (in_stack_fffffffffffffae0,__position,in_stack_fffffffffffffaf0,__last);
    }
    peer::set_last_sent_idx(ppVar23,(ulong)this_00);
    local_1c0 = 1;
    goto LAB_001b73fe;
  }
  get_last_snapshot(in_stack_fffffffffffffab8);
  bVar4 = std::__shared_ptr::operator_cast_to_bool(local_198);
  auVar3 = local_38;
  if ((bVar4) && ((ulong)local_38 < local_48)) {
    peVar16 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b649e);
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)snapshot::get_last_log_idx(peVar16);
    if (p_Var17 <= (ulong)auVar3) goto LAB_001b66c4;
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar4) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b64fa);
      iVar5 = (*peVar11->_vptr_logger[7])();
      if (4 < iVar5) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b6533);
        uVar6 = peer::get_id((peer *)0x1b6548);
        auVar3 = local_38;
        p_Var17 = local_48;
        _Var24._M_pi = local_28._M_pi;
        peVar16 = std::
                  __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b658e);
        uVar10 = snapshot::get_last_log_idx(peVar16);
        msg_if_given_abi_cxx11_
                  ((char *)local_1b8,
                   "send snapshot peer %d, peer log idx: %lu, my starting idx: %lu, my log idx: %lu, last_snapshot_log_idx: %lu"
                   ,(ulong)uVar6,auVar3,p_Var17,_Var24._M_pi,uVar10);
        (*peVar11->_vptr_logger[8])
                  (peVar11,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1d5,local_1b8);
        std::__cxx11::string::~string(local_1b8);
      }
    }
    local_1b9 = 0;
    create_sync_snapshot_req
              (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
               in_stack_00000018,in_stack_00000050);
    local_1c0 = 1;
  }
  else {
LAB_001b66c4:
    if ((create_append_entries_req(std::shared_ptr<nuraft::peer>&)::msg_timer == '\0') &&
       (iVar5 = __cxa_guard_acquire(&create_append_entries_req(std::shared_ptr<nuraft::peer>&)::
                                     msg_timer), iVar5 != 0)) {
      timer_helper::timer_helper
                (in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8,(bool)fire_first_event)
      ;
      __cxa_guard_release(&create_append_entries_req(std::shared_ptr<nuraft::peer>&)::msg_timer);
    }
    bVar4 = timer_helper::timeout_and_reset
                      ((timer_helper *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                      );
    local_1c4 = 6;
    if (bVar4) {
      local_1c4 = 2;
    }
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar4) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b6763);
      iVar5 = (*peVar11->_vptr_logger[7])();
      if ((int)local_1c4 <= iVar5) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b67a0);
        uVar6 = local_1c4;
        uVar7 = peer::get_id((peer *)0x1b67c3);
        msg_if_given_abi_cxx11_
                  ((char *)local_1e8,
                   "neither snapshot nor log exists, peer %d, last log %lu, leader\'s start log %lu"
                   ,(ulong)uVar7,local_38,local_48);
        (*peVar11->_vptr_logger[8])
                  (peVar11,(ulong)uVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1e2,local_1e8);
        std::__cxx11::string::~string(local_1e8);
      }
    }
    local_1e9 = 0;
    local_1f0 = 0x1c;
    local_1f4 = peer::get_id((peer *)0x1b68bf);
    local_1f8 = 0;
    this_01 = (shared_ptr<nuraft::buffer> *)&stack0xffffffffffffffd0;
    __r = (shared_ptr<nuraft::buffer> *)local_38;
    cs_new<nuraft::req_msg,unsigned_long&,nuraft::msg_type,int&,int,int,unsigned_long&,unsigned_long&>
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,(int *)in_stack_fffffffffffffab8,
               (int *)in_stack_fffffffffffffab0,(int *)in_stack_fffffffffffffaa8,
               (unsigned_long *)in_stack_fffffffffffffae0,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    cs_new<nuraft::out_of_log_msg>();
    p_Var17 = local_48;
    peVar18 = std::
              __shared_ptr_access<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b695e);
    peVar18->start_idx_of_leader_ = (ulong)p_Var17;
    local_21c = 1;
    cs_new<nuraft::custom_notification_msg,nuraft::custom_notification_msg::type>((type *)__r);
    std::__shared_ptr_access<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b6998);
    out_of_log_msg::serialize
              ((out_of_log_msg *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    std::
    __shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b69bf);
    std::shared_ptr<nuraft::buffer>::operator=(this_01,__r);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1b69e8);
    local_244 = 0;
    std::
    __shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b6a00);
    custom_notification_msg::serialize
              ((custom_notification_msg *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    local_259 = 0xe7;
    cs_new<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
              ((int *)in_stack_fffffffffffffaa8,this_01,(log_val_type *)__r);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1b6a4e);
    peVar19 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b6a5b);
    req_msg::log_entries(peVar19);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)in_stack_fffffffffffffab0,(value_type *)in_stack_fffffffffffffaa8);
    local_1e9 = 1;
    local_1c0 = 1;
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1b6aa4);
    std::shared_ptr<nuraft::custom_notification_msg>::~shared_ptr
              ((shared_ptr<nuraft::custom_notification_msg> *)0x1b6ab1);
    std::shared_ptr<nuraft::out_of_log_msg>::~shared_ptr
              ((shared_ptr<nuraft::out_of_log_msg> *)0x1b6abe);
    if ((local_1e9 & 1) == 0) {
      std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x1b6b83);
    }
  }
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x1b6ba1);
LAB_001b73fe:
  std::
  shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
  ::~shared_ptr((shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
                 *)0x1b740b);
  pVar22.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar22.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<req_msg>)pVar22.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<req_msg> raft_server::create_append_entries_req(ptr<peer>& pp) {
    peer& p = *pp;
    ulong cur_nxt_idx(0L);
    ulong commit_idx(0L);
    ulong last_log_idx(0L);
    ulong term(0L);
    ulong starting_idx(1L);

    {
        recur_lock(lock_);
        starting_idx = log_store_->start_index();
        cur_nxt_idx = precommit_index_ + 1;
        commit_idx = quick_commit_index_;
        term = state_->get_term();
    }

    {
        std::lock_guard<std::mutex> guard(p.get_lock());
        if (p.get_next_log_idx() == 0L) {
            p.set_next_log_idx(cur_nxt_idx);
        }

        last_log_idx = p.get_next_log_idx() - 1;
    }

    if (last_log_idx >= cur_nxt_idx) {
        // LCOV_EXCL_START
        p_er( "Peer's lastLogIndex is too large %" PRIu64 " v.s. %" PRIu64 ", ",
              last_log_idx, cur_nxt_idx );
        ctx_->state_mgr_->system_exit(raft_err::N8_peer_last_log_idx_too_large);
        ::exit(-1);
        return ptr<req_msg>();
        // LCOV_EXCL_STOP
    }

    // cur_nxt_idx: last log index of myself (leader).
    // starting_idx: start log index of myself (leader).
    // last_log_idx: last log index of replica (follower).
    // end_idx: if (cur_nxt_idx - last_log_idx) > max_append_size, limit it.

    p_tr("last_log_idx: %" PRIu64 ", starting_idx: %" PRIu64
         ", cur_nxt_idx: %" PRIu64 "\n",
         last_log_idx, starting_idx, cur_nxt_idx);

    // Verify log index range.
    bool entries_valid = (last_log_idx + 1 >= starting_idx);

    // Read log entries. The underlying log store may have removed some log entries
    // causing some of the requested entries to be unavailable. The log store should
    // return nullptr to indicate such errors.
    ulong end_idx = std::min( cur_nxt_idx,
                              last_log_idx + 1 + ctx_->get_params()->max_append_size_ );

    // NOTE: If this is a retry, probably the follower is down.
    //       Send just one log until it comes back
    //       (i.e., max_append_size_ = 1).
    //       Only when end_idx - start_idx > 1, and 5th try.
    ulong peer_last_sent_idx = p.get_last_sent_idx();
    if ( last_log_idx + 1 == peer_last_sent_idx &&
         last_log_idx + 2 < end_idx ) {
        int32 cur_cnt = p.inc_cnt_not_applied();
        p_db("last sent log (%" PRIu64 ") to peer %d is not applied, cnt %d",
             peer_last_sent_idx, p.get_id(), cur_cnt);
        if (cur_cnt >= 5) {
            ulong prev_end_idx = end_idx;
            end_idx = std::min( cur_nxt_idx, last_log_idx + 1 + 1 );
            p_db("reduce end_idx %" PRIu64 " -> %" PRIu64, prev_end_idx, end_idx);
        }
    } else {
        p.reset_cnt_not_applied();
    }

    ptr<std::vector<ptr<log_entry>>> log_entries;
    if ((last_log_idx + 1) >= cur_nxt_idx) {
        log_entries = ptr<std::vector<ptr<log_entry>>>();
    } else if (entries_valid) {
        log_entries = log_store_->log_entries_ext(last_log_idx + 1, end_idx,
                                                  p.get_next_batch_size_hint_in_bytes());
        if (log_entries == nullptr) {
            p_wn("failed to retrieve log entries: %" PRIu64 " - %" PRIu64,
                 last_log_idx + 1, end_idx);
            entries_valid = false;
        }
    }

    if (!entries_valid) {
        // Required log entries are missing. First, we try to use snapshot to recover.
        // To avoid inconsistency due to smart pointer, should have local varaible
        // to increase its ref count.
        ptr<snapshot> snp_local = get_last_snapshot();

        // Modified by Jung-Sang Ahn (Oct 11 2017):
        // As `reserved_log` has been newly added, need to check snapshot
        // in addition to `starting_idx`.
        if ( snp_local &&
             last_log_idx < starting_idx &&
             last_log_idx < snp_local->get_last_log_idx() ) {
            p_db( "send snapshot peer %d, peer log idx: %" PRIu64
                  ", my starting idx: %" PRIu64 ", "
                  "my log idx: %" PRIu64 ", last_snapshot_log_idx: %" PRIu64,
                  p.get_id(),
                  last_log_idx, starting_idx, cur_nxt_idx,
                  snp_local->get_last_log_idx() );

            bool succeeded_out = false;
            return create_sync_snapshot_req( pp, last_log_idx, term,
                                             commit_idx, succeeded_out );
        }

        // Cannot recover using snapshot. Return here to protect the leader.
        static timer_helper msg_timer(5000000);
        int log_lv = msg_timer.timeout_and_reset() ? L_ERROR : L_TRACE;
        p_lv(log_lv,
             "neither snapshot nor log exists, peer %d, last log %" PRIu64 ", "
             "leader's start log %" PRIu64,
             p.get_id(), last_log_idx, starting_idx);

        // Send out-of-log-range notification to this follower.
        ptr<req_msg> req = cs_new<req_msg>
                           ( term, msg_type::custom_notification_request,
                             id_, p.get_id(), 0, last_log_idx, commit_idx );

        // Out-of-log message.
        ptr<out_of_log_msg> ool_msg = cs_new<out_of_log_msg>();
        ool_msg->start_idx_of_leader_ = starting_idx;

        // Create a notification containing OOL message.
        ptr<custom_notification_msg> custom_noti =
            cs_new<custom_notification_msg>
            ( custom_notification_msg::out_of_log_range_warning );
        custom_noti->ctx_ = ool_msg->serialize();

        // Wrap it using log_entry.
        ptr<log_entry> custom_noti_le =
            cs_new<log_entry>(0, custom_noti->serialize(), log_val_type::custom);

        req->log_entries().push_back(custom_noti_le);
        return req;
    }

    ulong last_log_term = term_for_log(last_log_idx);
    ulong adjusted_end_idx = end_idx;
    if (log_entries) adjusted_end_idx = last_log_idx + 1 + log_entries->size();
    if (adjusted_end_idx != end_idx) {
        p_tr("adjusted end_idx due to batch size hint: %" PRIu64 " -> %" PRIu64,
             end_idx, adjusted_end_idx);
    }

    p_db( "append_entries for %d with LastLogIndex=%" PRIu64 ", "
          "LastLogTerm=%" PRIu64 ", EntriesLength=%zu, CommitIndex=%" PRIu64 ", "
          "Term=%" PRIu64 ", peer_last_sent_idx %" PRIu64,
          p.get_id(), last_log_idx, last_log_term,
          ( log_entries ? log_entries->size() : 0 ), commit_idx, term,
          peer_last_sent_idx );
    if (last_log_idx+1 == adjusted_end_idx) {
        p_tr( "EMPTY PAYLOAD" );
    } else if (last_log_idx+1 + 1 == adjusted_end_idx) {
        p_db( "idx: %" PRIu64, last_log_idx+1 );
    } else {
        p_db( "idx range: %" PRIu64 "-%" PRIu64, last_log_idx+1, adjusted_end_idx-1 );
    }

    ptr<req_msg> req
        ( cs_new<req_msg>
          ( term, msg_type::append_entries_request, id_, p.get_id(),
            last_log_term, last_log_idx, commit_idx ) );
    std::vector<ptr<log_entry>>& v = req->log_entries();
    if (log_entries) {
        v.insert(v.end(), log_entries->begin(), log_entries->end());
    }
    p.set_last_sent_idx(last_log_idx + 1);

    return req;
}